

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  char *pcVar1;
  
  pcVar1 = (this->super_buffer<char>).ptr_;
  if (pcVar1 != this->store_) {
    operator_delete(pcVar1,(this->super_buffer<char>).capacity_);
  }
  move(this,other);
  return this;
}

Assistant:

auto operator=(basic_memory_buffer&& other) noexcept -> basic_memory_buffer& {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }